

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_device_start__jack(ma_device *pDevice)

{
  ma_context *pmVar1;
  long lVar2;
  int iVar3;
  ma_device_type mVar4;
  long lVar5;
  undefined8 uVar6;
  ma_result in_ECX;
  ma_result resultCode;
  undefined8 uVar7;
  char *message;
  long lVar8;
  char *pServerPort;
  
  pmVar1 = pDevice->pContext;
  iVar3 = (*(pmVar1->field_21).alsa.snd_pcm_hw_params_set_rate_near)
                    ((pDevice->field_23).alsa.pPCMPlayback);
  if (iVar3 != 0) {
    ma_post_error(pDevice,1,"[JACK] Failed to activate the JACK client.",in_ECX);
    return -0x12e;
  }
  mVar4 = pDevice->type;
  if ((mVar4 & ~ma_device_type_playback) == ma_device_type_capture) {
    uVar7 = 6;
    lVar5 = (*(pmVar1->field_21).alsa.snd_pcm_hw_params_set_rate_resample)
                      ((pDevice->field_23).alsa.pPCMPlayback,0,"32 bit float mono audio");
    resultCode = (ma_result)uVar7;
    if (lVar5 == 0) goto LAB_0010e097;
    lVar8 = 0;
    do {
      lVar2 = *(long *)(lVar5 + lVar8);
      if (lVar2 == 0) {
        (*(pmVar1->field_21).alsa.snd_pcm_hw_params_get_channels_min)(lVar5);
        mVar4 = pDevice->type;
        goto LAB_0010e00c;
      }
      uVar6 = (*(pmVar1->field_21).alsa.snd_pcm_hw_params_get_format)
                        (*(undefined8 *)((long)&pDevice->field_23 + lVar8 + 0x108));
      iVar3 = (*(pmVar1->field_21).alsa.snd_pcm_hw_params_set_periods_near)
                        ((pDevice->field_23).alsa.pPCMPlayback,lVar2,uVar6);
      resultCode = (ma_result)uVar7;
      lVar8 = lVar8 + 8;
    } while (iVar3 == 0);
  }
  else {
LAB_0010e00c:
    if ((mVar4 | ma_device_type_capture) != ma_device_type_duplex) {
      return 0;
    }
    uVar7 = 5;
    lVar5 = (*(pmVar1->field_21).alsa.snd_pcm_hw_params_set_rate_resample)
                      ((pDevice->field_23).alsa.pPCMPlayback,0,"32 bit float mono audio");
    resultCode = (ma_result)uVar7;
    if (lVar5 == 0) {
LAB_0010e097:
      (*(pmVar1->field_21).alsa.snd_pcm_hw_params_set_buffer_size_near)
                ((pDevice->field_23).alsa.pPCMPlayback);
      message = "[JACK] Failed to retrieve physical ports.";
      goto LAB_0010e0ad;
    }
    lVar8 = 0;
    do {
      lVar2 = *(long *)(lVar5 + lVar8);
      if (lVar2 == 0) {
        (*(pmVar1->field_21).alsa.snd_pcm_hw_params_get_channels_min)(lVar5);
        return 0;
      }
      uVar6 = (*(pmVar1->field_21).alsa.snd_pcm_hw_params_get_format)
                        (*(undefined8 *)((long)&pDevice->field_23 + lVar8 + 8));
      iVar3 = (*(pmVar1->field_21).alsa.snd_pcm_hw_params_set_periods_near)
                        ((pDevice->field_23).alsa.pPCMPlayback,uVar6,lVar2);
      resultCode = (ma_result)uVar7;
      lVar8 = lVar8 + 8;
    } while (iVar3 == 0);
  }
  (*(pmVar1->field_21).alsa.snd_pcm_hw_params_get_channels_min)(lVar5);
  (*(pmVar1->field_21).alsa.snd_pcm_hw_params_set_buffer_size_near)
            ((pDevice->field_23).alsa.pPCMPlayback);
  message = "[JACK] Failed to connect ports.";
LAB_0010e0ad:
  ma_post_error(pDevice,1,message,resultCode);
  return -1;
}

Assistant:

static ma_result ma_device_start__jack(ma_device* pDevice)
{
    ma_context* pContext = pDevice->pContext;
    int resultJACK;
    size_t i;

    resultJACK = ((ma_jack_activate_proc)pContext->jack.jack_activate)((ma_jack_client_t*)pDevice->jack.pClient);
    if (resultJACK != 0) {
        return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[JACK] Failed to activate the JACK client.", MA_FAILED_TO_START_BACKEND_DEVICE);
    }

    if (pDevice->type == ma_device_type_capture || pDevice->type == ma_device_type_duplex) {
        const char** ppServerPorts = ((ma_jack_get_ports_proc)pContext->jack.jack_get_ports)((ma_jack_client_t*)pDevice->jack.pClient, NULL, MA_JACK_DEFAULT_AUDIO_TYPE, ma_JackPortIsPhysical | ma_JackPortIsOutput);
        if (ppServerPorts == NULL) {
            ((ma_jack_deactivate_proc)pContext->jack.jack_deactivate)((ma_jack_client_t*)pDevice->jack.pClient);
            return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[JACK] Failed to retrieve physical ports.", MA_ERROR);
        }

        for (i = 0; ppServerPorts[i] != NULL; ++i) {
            const char* pServerPort = ppServerPorts[i];
            const char* pClientPort = ((ma_jack_port_name_proc)pContext->jack.jack_port_name)((ma_jack_port_t*)pDevice->jack.pPortsCapture[i]);

            resultJACK = ((ma_jack_connect_proc)pContext->jack.jack_connect)((ma_jack_client_t*)pDevice->jack.pClient, pServerPort, pClientPort);
            if (resultJACK != 0) {
                ((ma_jack_free_proc)pContext->jack.jack_free)((void*)ppServerPorts);
                ((ma_jack_deactivate_proc)pContext->jack.jack_deactivate)((ma_jack_client_t*)pDevice->jack.pClient);
                return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[JACK] Failed to connect ports.", MA_ERROR);
            }
        }

        ((ma_jack_free_proc)pContext->jack.jack_free)((void*)ppServerPorts);
    }
    
    if (pDevice->type == ma_device_type_playback || pDevice->type == ma_device_type_duplex) {
        const char** ppServerPorts = ((ma_jack_get_ports_proc)pContext->jack.jack_get_ports)((ma_jack_client_t*)pDevice->jack.pClient, NULL, MA_JACK_DEFAULT_AUDIO_TYPE, ma_JackPortIsPhysical | ma_JackPortIsInput);
        if (ppServerPorts == NULL) {
            ((ma_jack_deactivate_proc)pContext->jack.jack_deactivate)((ma_jack_client_t*)pDevice->jack.pClient);
            return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[JACK] Failed to retrieve physical ports.", MA_ERROR);
        }

        for (i = 0; ppServerPorts[i] != NULL; ++i) {
            const char* pServerPort = ppServerPorts[i];
            const char* pClientPort = ((ma_jack_port_name_proc)pContext->jack.jack_port_name)((ma_jack_port_t*)pDevice->jack.pPortsPlayback[i]);

            resultJACK = ((ma_jack_connect_proc)pContext->jack.jack_connect)((ma_jack_client_t*)pDevice->jack.pClient, pClientPort, pServerPort);
            if (resultJACK != 0) {
                ((ma_jack_free_proc)pContext->jack.jack_free)((void*)ppServerPorts);
                ((ma_jack_deactivate_proc)pContext->jack.jack_deactivate)((ma_jack_client_t*)pDevice->jack.pClient);
                return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[JACK] Failed to connect ports.", MA_ERROR);
            }
        }

        ((ma_jack_free_proc)pContext->jack.jack_free)((void*)ppServerPorts);
    }

    return MA_SUCCESS;
}